

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorRole fr,ColorRole br)

{
  QSharedDataPointer<QStyleSheetBackgroundData> *this_00;
  QStyleSheetBackgroundData *pQVar1;
  QStyleSheetPaletteData *pQVar2;
  ColorGroup CVar3;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QBrush aQStack_48 [8];
  QColor local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->bg;
  pQVar1 = (this->bg).d.ptr;
  if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
     ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
  }
  pQVar1 = (this_00->d).ptr;
  CVar3 = (ColorGroup)p;
  if (pQVar1 != (QStyleSheetBackgroundData *)0x0) {
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
    }
    pQVar1 = (this_00->d).ptr;
    if (*(int *)(*(long *)&pQVar1->brush + 4) != 0) {
      if (br != NoRole) {
        if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
        }
        QPalette::setBrush(CVar3,Mid,(QBrush *)(ulong)br);
      }
      pQVar1 = (this_00->d).ptr;
      if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      QPalette::setBrush(CVar3,Mid,(QBrush *)&DAT_0000000a);
      pQVar1 = (this_00->d).ptr;
      if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
      }
      pQVar1 = (this_00->d).ptr;
      if (*(int *)(*(long *)&pQVar1->brush + 4) == 1) {
        if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
        }
        auVar4 = QColor::lighter((int)*(undefined8 *)&((this_00->d).ptr)->brush + 8);
        local_40._0_8_ = auVar4._0_8_;
        local_40.ct._4_4_ = auVar4._8_4_;
        local_40.ct.argb.pad = auVar4._12_2_;
        QBrush::QBrush(aQStack_48,&local_40,SolidPattern);
        QPalette::setBrush(CVar3,Mid,(QBrush *)0x2);
        QBrush::~QBrush(aQStack_48);
        pQVar1 = (this_00->d).ptr;
        if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
        }
        auVar4 = QColor::lighter((int)*(undefined8 *)&((this_00->d).ptr)->brush + 8);
        local_40._0_8_ = auVar4._0_8_;
        local_40.ct._4_4_ = auVar4._8_4_;
        local_40.ct.argb.pad = auVar4._12_2_;
        QBrush::QBrush(aQStack_48,&local_40,SolidPattern);
        QPalette::setBrush(CVar3,Mid,(QBrush *)0x3);
        QBrush::~QBrush(aQStack_48);
        pQVar1 = (this_00->d).ptr;
        if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
        }
        auVar4 = QColor::darker((int)*(undefined8 *)&((this_00->d).ptr)->brush + 8);
        local_40._0_8_ = auVar4._0_8_;
        local_40.ct._4_4_ = auVar4._8_4_;
        local_40.ct.argb.pad = auVar4._12_2_;
        QBrush::QBrush(aQStack_48,&local_40,SolidPattern);
        QPalette::setBrush(CVar3,Mid,(QBrush *)0x4);
        QBrush::~QBrush(aQStack_48);
        pQVar1 = (this_00->d).ptr;
        if ((pQVar1 != (QStyleSheetBackgroundData *)0x0) &&
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_00);
        }
        auVar4 = QColor::darker((int)*(undefined8 *)&((this_00->d).ptr)->brush + 8);
        local_40._0_8_ = auVar4._0_8_;
        local_40.ct._4_4_ = auVar4._8_4_;
        local_40.ct.argb.pad = auVar4._12_2_;
        QBrush::QBrush(aQStack_48,&local_40,SolidPattern);
        QPalette::setBrush(CVar3,Mid,(QBrush *)&DAT_0000000b);
        QBrush::~QBrush(aQStack_48);
      }
    }
  }
  pQVar2 = (this->pal).d.ptr;
  if (pQVar2 != (QStyleSheetPaletteData *)0x0) {
    this_01 = &this->pal;
    if ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar2 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar2->foreground + 4) != 0) {
      if (fr != NoRole) {
        if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
           ((__int_type)
            (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
        }
        QPalette::setBrush(CVar3,Mid,(QBrush *)(ulong)fr);
      }
      pQVar2 = (this_01->d).ptr;
      if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar3,Mid,(QBrush *)0x0);
      pQVar2 = (this_01->d).ptr;
      if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar3,Mid,(QBrush *)0x6);
    }
    pQVar2 = (this_01->d).ptr;
    if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar2 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar2->selectionBackground + 4) != 0) {
      if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar3,Mid,(QBrush *)0xc);
    }
    pQVar2 = (this_01->d).ptr;
    if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar2 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar2->selectionForeground + 4) != 0) {
      if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar3,Mid,(QBrush *)0xd);
    }
    pQVar2 = (this_01->d).ptr;
    if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1)) {
      QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
    }
    pQVar2 = (this_01->d).ptr;
    if (*(int *)(*(long *)&pQVar2->alternateBackground + 4) != 0) {
      if ((pQVar2 != (QStyleSheetPaletteData *)0x0) &&
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1)) {
        QSharedDataPointer<QStyleSheetPaletteData>::detach_helper(this_01);
      }
      QPalette::setBrush(CVar3,Mid,(QBrush *)0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorRole fr, QPalette::ColorRole br)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        if (br != QPalette::NoRole)
            p->setBrush(br, bg->brush);
        p->setBrush(QPalette::Window, bg->brush);
        if (bg->brush.style() == Qt::SolidPattern) {
            p->setBrush(QPalette::Light, bg->brush.color().lighter(115));
            p->setBrush(QPalette::Midlight, bg->brush.color().lighter(107));
            p->setBrush(QPalette::Dark, bg->brush.color().darker(150));
            p->setBrush(QPalette::Shadow, bg->brush.color().darker(300));
        }
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        if (fr != QPalette::NoRole)
            p->setBrush(fr, pal->foreground);
        p->setBrush(QPalette::WindowText, pal->foreground);
        p->setBrush(QPalette::Text, pal->foreground);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(QPalette::AlternateBase, pal->alternateBackground);
}